

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.h
# Opt level: O1

sbyte * __thiscall IceMaths::AABB::ComputeOutline(AABB *this,Point *param_1,sdword *num)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  ulong uVar8;
  sbyte (*pasVar9) [8];
  
  fVar1 = (this->mExtents).x;
  fVar2 = (this->mCenter).x;
  fVar3 = (this->mCenter).y;
  fVar4 = (this->mExtents).y;
  fVar5 = (this->mCenter).z;
  fVar6 = (this->mExtents).z;
  uVar8 = (ulong)(fVar5 + fVar6 < param_1->z) << 5 |
          (ulong)(param_1->z < fVar5 - fVar6) << 4 |
          (ulong)(param_1->x < fVar2 - fVar1) + (ulong)(fVar2 + fVar1 < param_1->x) * 2 +
          (ulong)(param_1->y < fVar3 - fVar4) * 4 + (ulong)(fVar3 + fVar4 < param_1->y) * 8;
  cVar7 = gIndexList[uVar8][7];
  *num = (int)cVar7;
  pasVar9 = (sbyte (*) [8])0x0;
  if (cVar7 != '\0') {
    pasVar9 = gIndexList + uVar8;
  }
  return *pasVar9;
}

Assistant:

inline_	Point			operator-(const Point& p)			const		{ return Point(x - p.x, y - p.y, z - p.z);			}